

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmNinjaNormalTargetGenerator::ComputeLinkCmd
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmNinjaNormalTargetGenerator *this,string *config)

{
  cmMakefile *this_00;
  cmGeneratorTarget *pcVar1;
  pointer pcVar2;
  long *plVar3;
  cmLocalNinjaGenerator *pcVar4;
  pointer pbVar5;
  pointer pbVar6;
  bool bVar7;
  TargetType TVar8;
  cmValue cVar9;
  string *psVar10;
  cmGlobalNinjaGenerator *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  pointer pbVar12;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  string_view source;
  string_view str;
  string_view source_00;
  string linkCmdStr;
  string linkCmdVar;
  cmList linkCmds;
  string cmakeCommand_1;
  string targetOutputReal;
  string ruleVar;
  string local_50;
  
  linkCmds.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  linkCmds.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  linkCmds.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  pcVar1 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  cmGeneratorTarget::GetLinkerLanguage(&cmakeCommand_1,pcVar1,config);
  cmGeneratorTarget::GetCreateRuleVariable(&linkCmdVar,pcVar1,&cmakeCommand_1,config);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cmakeCommand_1._M_dataplus._M_p != &cmakeCommand_1.field_2) {
    operator_delete(cmakeCommand_1._M_dataplus._M_p,cmakeCommand_1.field_2._M_allocated_capacity + 1
                   );
  }
  cVar9 = cmMakefile::GetDefinition(this_00,&linkCmdVar);
  if (cVar9.Value == (string *)0x0) {
    paVar11 = &linkCmdVar.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkCmdVar._M_dataplus._M_p != paVar11) {
      operator_delete(linkCmdVar._M_dataplus._M_p,linkCmdVar.field_2._M_allocated_capacity + 1);
    }
    TVar8 = cmGeneratorTarget::GetType
                      ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                       GeneratorTarget);
    if ((1 < TVar8 - SHARED_LIBRARY) && (TVar8 != EXECUTABLE)) {
      if (TVar8 != STATIC_LIBRARY) {
        __assert_fail("false && \"Unexpected target type\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmNinjaNormalTargetGenerator.cxx"
                      ,0x316,
                      "std::vector<std::string> cmNinjaNormalTargetGenerator::ComputeLinkCmd(const std::string &)"
                     );
      }
      pcVar4 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
      psVar10 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      source_00._M_str = (psVar10->_M_dataplus)._M_p;
      source_00._M_len = psVar10->_M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&cmakeCommand_1,(cmOutputConverter *)pcVar4,source_00,SHELL,false);
      linkCmdVar._M_dataplus._M_p = (pointer)paVar11;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&linkCmdVar,cmakeCommand_1._M_dataplus._M_p,
                 cmakeCommand_1._M_dataplus._M_p + cmakeCommand_1._M_string_length);
      std::__cxx11::string::append((char *)&linkCmdVar);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&linkCmds,
                 &linkCmdVar);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkCmdVar._M_dataplus._M_p != paVar11) {
        operator_delete(linkCmdVar._M_dataplus._M_p,linkCmdVar.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cmakeCommand_1._M_dataplus._M_p != &cmakeCommand_1.field_2) {
        operator_delete(cmakeCommand_1._M_dataplus._M_p,
                        cmakeCommand_1.field_2._M_allocated_capacity + 1);
      }
      cmGeneratorTarget::GetLinkerLanguage
                (&linkCmdStr,
                 (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
                 config);
      cmakeCommand_1._M_dataplus._M_p = (pointer)0x6;
      cmakeCommand_1._M_string_length = (long)"The CMAKE_" + 4;
      cmakeCommand_1.field_2._M_allocated_capacity = 0;
      cmakeCommand_1.field_2._8_8_ = linkCmdStr._M_string_length;
      views_02._M_len = 3;
      views_02._M_array = (iterator)&cmakeCommand_1;
      cmCatViews(&linkCmdVar,views_02);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkCmdStr._M_dataplus._M_p != &linkCmdStr.field_2) {
        operator_delete(linkCmdStr._M_dataplus._M_p,linkCmdStr.field_2._M_allocated_capacity + 1);
      }
      pcVar1 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
      cmGeneratorTarget::GetLinkerLanguage(&linkCmdStr,pcVar1,config);
      cmGeneratorTarget::GetFeatureSpecificLinkRuleVariable
                (&cmakeCommand_1,pcVar1,&linkCmdVar,&linkCmdStr,config);
      std::__cxx11::string::operator=((string *)&linkCmdVar,(string *)&cmakeCommand_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cmakeCommand_1._M_dataplus._M_p != &cmakeCommand_1.field_2) {
        operator_delete(cmakeCommand_1._M_dataplus._M_p,
                        cmakeCommand_1.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkCmdStr._M_dataplus._M_p != &linkCmdStr.field_2) {
        operator_delete(linkCmdStr._M_dataplus._M_p,linkCmdStr.field_2._M_allocated_capacity + 1);
      }
      psVar10 = cmMakefile::GetRequiredDefinition(this_00,&linkCmdVar);
      cmList::Insert(&linkCmds.Values,
                     (const_iterator)
                     linkCmds.Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,psVar10,Yes,No);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkCmdVar._M_dataplus._M_p != paVar11) {
        operator_delete(linkCmdVar._M_dataplus._M_p,linkCmdVar.field_2._M_allocated_capacity + 1);
      }
      cmGeneratorTarget::GetLinkerLanguage
                (&linkCmdStr,
                 (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
                 config);
      cmakeCommand_1._M_dataplus._M_p = (pointer)0x6;
      cmakeCommand_1._M_string_length = (long)"The CMAKE_" + 4;
      cmakeCommand_1.field_2._M_allocated_capacity = 0;
      cmakeCommand_1.field_2._8_8_ = linkCmdStr._M_string_length;
      views_03._M_len = 3;
      views_03._M_array = (iterator)&cmakeCommand_1;
      cmCatViews(&linkCmdVar,views_03);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkCmdStr._M_dataplus._M_p != &linkCmdStr.field_2) {
        operator_delete(linkCmdStr._M_dataplus._M_p,linkCmdStr.field_2._M_allocated_capacity + 1);
      }
      pcVar1 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
      cmGeneratorTarget::GetLinkerLanguage(&linkCmdStr,pcVar1,config);
      cmGeneratorTarget::GetFeatureSpecificLinkRuleVariable
                (&cmakeCommand_1,pcVar1,&linkCmdVar,&linkCmdStr,config);
      std::__cxx11::string::operator=((string *)&linkCmdVar,(string *)&cmakeCommand_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cmakeCommand_1._M_dataplus._M_p != &cmakeCommand_1.field_2) {
        operator_delete(cmakeCommand_1._M_dataplus._M_p,
                        cmakeCommand_1.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkCmdStr._M_dataplus._M_p != &linkCmdStr.field_2) {
        operator_delete(linkCmdStr._M_dataplus._M_p,linkCmdStr.field_2._M_allocated_capacity + 1);
      }
      psVar10 = cmMakefile::GetRequiredDefinition(this_00,&linkCmdVar);
      cmList::Insert(&linkCmds.Values,
                     (const_iterator)
                     linkCmds.Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,psVar10,Yes,No);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)linkCmdVar._M_dataplus._M_p != paVar11) {
        operator_delete(linkCmdVar._M_dataplus._M_p,linkCmdVar.field_2._M_allocated_capacity + 1);
      }
    }
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start =
         linkCmds.Values.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         linkCmds.Values.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         linkCmds.Values.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    linkCmds.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    linkCmds.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    linkCmds.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    linkCmdStr._M_dataplus._M_p = (pointer)&linkCmdStr.field_2;
    pcVar2 = ((cVar9.Value)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&linkCmdStr,pcVar2,pcVar2 + (cVar9.Value)->_M_string_length);
    bVar7 = cmGeneratorTarget::HasImplibGNUtoMS
                      ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                       GeneratorTarget,config);
    if (bVar7) {
      cmGeneratorTarget::GetLinkerLanguage
                (&targetOutputReal,
                 (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
                 config);
      cmakeCommand_1._M_dataplus._M_p = (pointer)0x6;
      cmakeCommand_1._M_string_length = (long)"The CMAKE_" + 4;
      cmakeCommand_1.field_2._M_allocated_capacity = 0;
      cmakeCommand_1.field_2._8_8_ = targetOutputReal._M_string_length;
      views._M_len = 3;
      views._M_array = (iterator)&cmakeCommand_1;
      cmCatViews(&ruleVar,views);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetOutputReal._M_dataplus._M_p != &targetOutputReal.field_2) {
        operator_delete(targetOutputReal._M_dataplus._M_p,
                        targetOutputReal.field_2._M_allocated_capacity + 1);
      }
      cVar9 = cmMakefile::GetDefinition
                        ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile
                         ,&ruleVar);
      if (cVar9.Value != (string *)0x0) {
        std::__cxx11::string::_M_append
                  ((char *)&linkCmdStr,(ulong)((cVar9.Value)->_M_dataplus)._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ruleVar._M_dataplus._M_p != &ruleVar.field_2) {
        operator_delete(ruleVar._M_dataplus._M_p,ruleVar.field_2._M_allocated_capacity + 1);
      }
    }
    pbVar6 = linkCmds.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar5 = linkCmds.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (linkCmds.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        linkCmds.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      paVar11 = &(linkCmds.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->field_2;
      do {
        plVar3 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (paVar11 + -1))->_M_dataplus)._M_p;
        if (paVar11 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar3) {
          operator_delete(plVar3,paVar11->_M_allocated_capacity + 1);
        }
        pbVar12 = (pointer)(paVar11 + 1);
        paVar11 = paVar11 + 2;
      } while (pbVar12 != pbVar6);
      linkCmds.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
    }
    cmList::Insert(&linkCmds.Values,
                   (const_iterator)
                   linkCmds.Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&linkCmdStr,Yes,No);
    if ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.UseLWYU == true) {
      cmakeCommand_1._M_dataplus._M_p = (pointer)&cmakeCommand_1.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&cmakeCommand_1,"CMAKE_LINK_WHAT_YOU_USE_CHECK","");
      cVar9 = cmMakefile::GetDefinition(this_00,&cmakeCommand_1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cmakeCommand_1._M_dataplus._M_p != &cmakeCommand_1.field_2) {
        operator_delete(cmakeCommand_1._M_dataplus._M_p,
                        cmakeCommand_1.field_2._M_allocated_capacity + 1);
      }
      if (cVar9.Value != (string *)0x0) {
        pcVar4 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
        psVar10 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        source._M_str = (psVar10->_M_dataplus)._M_p;
        source._M_len = psVar10->_M_string_length;
        cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                  (&targetOutputReal,(cmOutputConverter *)pcVar4,source,SHELL,false);
        cmakeCommand_1._M_dataplus._M_p = (pointer)targetOutputReal._M_string_length;
        cmakeCommand_1._M_string_length = (size_type)targetOutputReal._M_dataplus._M_p;
        cmakeCommand_1.field_2._8_8_ = 0x1c;
        views_00._M_len = 2;
        views_00._M_array = (iterator)&cmakeCommand_1;
        cmakeCommand_1.field_2._M_allocated_capacity = (size_type)&targetOutputReal;
        cmCatViews(&ruleVar,views_00);
        paVar11 = &targetOutputReal.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)targetOutputReal._M_dataplus._M_p != paVar11) {
          operator_delete(targetOutputReal._M_dataplus._M_p,
                          targetOutputReal.field_2._M_allocated_capacity + 1);
        }
        str._M_str = ((cVar9.Value)->_M_dataplus)._M_p;
        str._M_len = (cVar9.Value)->_M_string_length;
        cmOutputConverter::EscapeForShell_abi_cxx11_
                  (&cmakeCommand_1,
                   (cmOutputConverter *)(this->super_cmNinjaTargetGenerator).LocalGenerator,str,
                   false,false,false,false,false);
        std::__cxx11::string::_M_append((char *)&ruleVar,(ulong)cmakeCommand_1._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)cmakeCommand_1._M_dataplus._M_p != &cmakeCommand_1.field_2) {
          operator_delete(cmakeCommand_1._M_dataplus._M_p,
                          cmakeCommand_1.field_2._M_allocated_capacity + 1);
        }
        cmGeneratorTarget::GetFullPath
                  (&cmakeCommand_1,
                   (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                   GeneratorTarget,config,RuntimeBinaryArtifact,true);
        this_01 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
        psVar10 = cmGlobalNinjaGenerator::ConvertToNinjaPath(this_01,&cmakeCommand_1);
        pcVar2 = (psVar10->_M_dataplus)._M_p;
        targetOutputReal._M_dataplus._M_p = (pointer)paVar11;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&targetOutputReal,pcVar2,pcVar2 + psVar10->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)cmakeCommand_1._M_dataplus._M_p != &cmakeCommand_1.field_2) {
          operator_delete(cmakeCommand_1._M_dataplus._M_p,
                          cmakeCommand_1.field_2._M_allocated_capacity + 1);
        }
        cmakeCommand_1._M_dataplus._M_p = (pointer)0xa;
        cmakeCommand_1._M_string_length = (size_type)anon_var_dwarf_173fc46;
        cmakeCommand_1.field_2._M_allocated_capacity = 0;
        cmakeCommand_1.field_2._8_8_ = targetOutputReal._M_string_length;
        views_01._M_len = 2;
        views_01._M_array = (iterator)&cmakeCommand_1;
        cmCatViews(&local_50,views_01);
        std::__cxx11::string::_M_append((char *)&ruleVar,(ulong)local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&linkCmds,
                   &ruleVar);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)targetOutputReal._M_dataplus._M_p != paVar11) {
          operator_delete(targetOutputReal._M_dataplus._M_p,
                          targetOutputReal.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)ruleVar._M_dataplus._M_p != &ruleVar.field_2) {
          operator_delete(ruleVar._M_dataplus._M_p,ruleVar.field_2._M_allocated_capacity + 1);
        }
      }
    }
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start =
         linkCmds.Values.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         linkCmds.Values.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         linkCmds.Values.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    linkCmds.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    linkCmds.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    linkCmds.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkCmdStr._M_dataplus._M_p != &linkCmdStr.field_2) {
      operator_delete(linkCmdStr._M_dataplus._M_p,linkCmdStr.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkCmdVar._M_dataplus._M_p != &linkCmdVar.field_2) {
      operator_delete(linkCmdVar._M_dataplus._M_p,linkCmdVar.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&linkCmds.Values);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmNinjaNormalTargetGenerator::ComputeLinkCmd(
  const std::string& config)
{
  cmList linkCmds;
  cmMakefile* mf = this->GetMakefile();
  {
    // If we have a rule variable prefer it. In the case of static libraries
    // this occurs when things like IPO is enabled, and we need to use the
    // CMAKE_<lang>_CREATE_STATIC_LIBRARY_IPO define instead.
    std::string linkCmdVar = this->GetGeneratorTarget()->GetCreateRuleVariable(
      this->TargetLinkLanguage(config), config);
    cmValue linkCmd = mf->GetDefinition(linkCmdVar);
    if (linkCmd) {
      std::string linkCmdStr = *linkCmd;
      if (this->GetGeneratorTarget()->HasImplibGNUtoMS(config)) {
        std::string ruleVar =
          cmStrCat("CMAKE_", this->GeneratorTarget->GetLinkerLanguage(config),
                   "_GNUtoMS_RULE");
        if (cmValue rule = this->Makefile->GetDefinition(ruleVar)) {
          linkCmdStr += *rule;
        }
      }
      linkCmds.assign(linkCmdStr);
      if (this->UseLWYU) {
        cmValue lwyuCheck = mf->GetDefinition("CMAKE_LINK_WHAT_YOU_USE_CHECK");
        if (lwyuCheck) {
          std::string cmakeCommand = cmStrCat(
            this->GetLocalGenerator()->ConvertToOutputFormat(
              cmSystemTools::GetCMakeCommand(), cmLocalGenerator::SHELL),
            " -E __run_co_compile --lwyu=");
          cmakeCommand +=
            this->GetLocalGenerator()->EscapeForShell(*lwyuCheck);

          std::string targetOutputReal =
            this->ConvertToNinjaPath(this->GetGeneratorTarget()->GetFullPath(
              config, cmStateEnums::RuntimeBinaryArtifact,
              /*realname=*/true));
          cmakeCommand += cmStrCat(" --source=", targetOutputReal);
          linkCmds.push_back(std::move(cmakeCommand));
        }
      }
      return std::move(linkCmds.data());
    }
  }
  switch (this->GetGeneratorTarget()->GetType()) {
    case cmStateEnums::STATIC_LIBRARY: {
      // We have archive link commands set. First, delete the existing archive.
      {
        std::string cmakeCommand =
          this->GetLocalGenerator()->ConvertToOutputFormat(
            cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
        linkCmds.push_back(cmakeCommand + " -E rm -f $TARGET_FILE");
      }
      // TODO: Use ARCHIVE_APPEND for archives over a certain size.
      {
        std::string linkCmdVar = cmStrCat(
          "CMAKE_", this->TargetLinkLanguage(config), "_ARCHIVE_CREATE");

        linkCmdVar = this->GeneratorTarget->GetFeatureSpecificLinkRuleVariable(
          linkCmdVar, this->TargetLinkLanguage(config), config);

        std::string const& linkCmd = mf->GetRequiredDefinition(linkCmdVar);
        linkCmds.append(linkCmd);
      }
      {
        std::string linkCmdVar = cmStrCat(
          "CMAKE_", this->TargetLinkLanguage(config), "_ARCHIVE_FINISH");

        linkCmdVar = this->GeneratorTarget->GetFeatureSpecificLinkRuleVariable(
          linkCmdVar, this->TargetLinkLanguage(config), config);

        std::string const& linkCmd = mf->GetRequiredDefinition(linkCmdVar);
        linkCmds.append(linkCmd);
      }
#ifdef __APPLE__
      // On macOS ranlib truncates the fractional part of the static archive
      // file modification time.  If the archive and at least one contained
      // object file were created within the same second this will make look
      // the archive older than the object file. On subsequent ninja runs this
      // leads to re-achiving and updating dependent targets.
      // As a work-around we touch the archive after ranlib (see #19222).
      {
        std::string cmakeCommand =
          this->GetLocalGenerator()->ConvertToOutputFormat(
            cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
        linkCmds.push_back(cmakeCommand + " -E touch $TARGET_FILE");
      }
#endif
    } break;
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
    case cmStateEnums::EXECUTABLE:
      break;
    default:
      assert(false && "Unexpected target type");
  }
  return std::move(linkCmds.data());
}